

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

SqueezeLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::SqueezeLayerParams>
          (Arena *arena)

{
  SqueezeLayerParams *pSVar1;
  
  if (arena != (Arena *)0x0) {
    pSVar1 = DoCreateMessage<CoreML::Specification::SqueezeLayerParams>(arena);
    return pSVar1;
  }
  pSVar1 = (SqueezeLayerParams *)operator_new(0x30);
  CoreML::Specification::SqueezeLayerParams::SqueezeLayerParams(pSVar1,(Arena *)0x0,false);
  return pSVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }